

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O3

ALLEGRO_PATH * al_create_path(char *str)

{
  _Bool _Var1;
  int end_pos;
  ALLEGRO_PATH *pAVar2;
  ALLEGRO_USTR *pAVar3;
  ALLEGRO_USTR *pAVar4;
  ALLEGRO_USTR *us2;
  ALLEGRO_USTR *us1;
  char *pcVar5;
  undefined8 *puVar6;
  ALLEGRO_USTR *pAVar7;
  size_t sVar8;
  int start_pos;
  _AL_VECTOR *vec;
  ALLEGRO_USTR_INFO dotdot_info;
  ALLEGRO_USTR_INFO dot_info;
  ALLEGRO_USTR_INFO local_50;
  ALLEGRO_USTR_INFO local_40;
  
  pAVar2 = (ALLEGRO_PATH *)
           al_malloc_with_context
                     (0x40,0xa0,
                      "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/path.c"
                      ,"al_create_path");
  if (pAVar2 == (ALLEGRO_PATH *)0x0) {
    return (ALLEGRO_PATH *)0x0;
  }
  pAVar3 = al_ustr_new("");
  pAVar2->drive = pAVar3;
  pAVar3 = al_ustr_new("");
  pAVar2->filename = pAVar3;
  vec = &pAVar2->segments;
  _al_vector_init(vec,8);
  pAVar3 = al_ustr_new("");
  pAVar2->basename = pAVar3;
  pAVar3 = al_ustr_new("");
  pAVar2->full_string = pAVar3;
  if (str != (char *)0x0) {
    pAVar3 = al_ustr_new(str);
    start_pos = 0;
    al_ustr_find_replace_cstr(pAVar3,0,"\\","/");
    pAVar4 = al_ref_cstr(&local_40,".");
    us2 = al_ref_cstr(&local_50,"..");
    us1 = al_ustr_new("");
    end_pos = al_ustr_find_chr(pAVar3,0,0x2f);
    if (end_pos != -1) {
      start_pos = 0;
      do {
        al_ustr_assign_substr(us1,pAVar3,start_pos,end_pos);
        pcVar5 = al_cstr(us1);
        puVar6 = (undefined8 *)_al_vector_alloc_back(vec);
        pAVar7 = al_ustr_new(pcVar5);
        *puVar6 = pAVar7;
        start_pos = end_pos + 1;
        end_pos = al_ustr_find_chr(pAVar3,start_pos,0x2f);
      } while (end_pos != -1);
    }
    sVar8 = al_ustr_size(pAVar3);
    al_ustr_assign_substr(us1,pAVar3,start_pos,(int)sVar8);
    _Var1 = al_ustr_equal(us1,pAVar4);
    if ((_Var1) || (_Var1 = al_ustr_equal(us1,us2), _Var1)) {
      pcVar5 = al_cstr(us1);
      puVar6 = (undefined8 *)_al_vector_alloc_back(vec);
      pAVar4 = al_ustr_new(pcVar5);
      *puVar6 = pAVar4;
    }
    else {
      al_ustr_assign(pAVar2->filename,us1);
    }
    al_ustr_free(us1);
    al_ustr_free(pAVar3);
    return pAVar2;
  }
  return pAVar2;
}

Assistant:

ALLEGRO_PATH *al_create_path(const char *str)
{
   ALLEGRO_PATH *path;

   path = al_malloc(sizeof(ALLEGRO_PATH));
   if (!path)
      return NULL;

   path->drive = al_ustr_new("");
   path->filename = al_ustr_new("");
   _al_vector_init(&path->segments, sizeof(ALLEGRO_USTR *));
   path->basename = al_ustr_new("");
   path->full_string = al_ustr_new("");

   if (str != NULL) {
      ALLEGRO_USTR *copy = al_ustr_new(str);
      replace_backslashes(copy);

      if (!parse_path_string(copy, path)) {
         al_destroy_path(path);
         path = NULL;
      }

      al_ustr_free(copy);
   }

   return path;
}